

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O1

MP<8UL,_GF2::MOGrevlex<8UL>_> * __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::SPoly
          (MP<8UL,_GF2::MOGrevlex<8UL>_> *this,size_t i,MP<8UL,_GF2::MOGrevlex<8UL>_> *poly)

{
  size_t *psVar1;
  ulong uVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  
  std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::clear
            (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>);
  p_Var4 = (poly->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
           super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var4 != (_List_node_base *)poly) {
    do {
      uVar2 = *(ulong *)&((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)(p_Var4 + 1))->
                         super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>;
      p_Var3 = (_List_node_base *)operator_new(0x18);
      p_Var3[1]._M_next = (_List_node_base *)(uVar2 | 1L << ((byte)i & 0x3f));
      std::__detail::_List_node_base::_M_hook(p_Var3);
      psVar1 = &(this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
                super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl._M_node.
                _M_size;
      *psVar1 = *psVar1 + 1;
      p_Var4 = (((list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_> *)&p_Var4->_M_next)->
               super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)poly);
  }
  Normalize(this);
  return this;
}

Assistant:

MP& SPoly(size_t i, const MP& poly)
	{
		// предусловия
		assert(this != &poly && IsConsistent(poly));
		// сбор мономов
		MM<_n> m;
		SetEmpty();
		for (const_iterator iter = poly.begin(); iter != poly.end(); ++iter)
			(m = *iter).Set(i, 1), push_back(m);
		// нормализация
		Normalize();
		return *this;
	}